

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

bool __thiscall
cmLocalUnixMakefileGenerator3::ScanDependencies
          (cmLocalUnixMakefileGenerator3 *this,char *targetDir,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  cmMakefile *this_00;
  bool bVar1;
  byte bVar2;
  Encoding EVar3;
  char *pcVar4;
  reference pbVar5;
  cmake *this_01;
  cmFileTimeComparison *fc;
  cmDependsC *local_6f8;
  cmDepends *scanner;
  string lang;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6c8;
  iterator li;
  string local_6b8;
  undefined1 local_698 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  string local_678;
  char *local_658;
  char *langStr;
  cmGeneratedFileStream internalRuleFileStream;
  string internalRuleFileNameFull;
  undefined1 local_3e0 [8];
  cmGeneratedFileStream ruleFileStream;
  string ruleFileNameFull;
  string local_170 [8];
  string dir;
  allocator local_121;
  string local_120;
  char *local_100;
  char *relativePathTopBinary;
  allocator local_c9;
  string local_c8;
  char *local_a8;
  char *relativePathTopSource;
  string local_98;
  char *local_78;
  char *force;
  allocator local_59;
  string local_58 [8];
  string dirInfoFile;
  bool haveDirectoryInfo;
  cmMakefile *mf;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *validDeps_local;
  char *targetDir_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  dirInfoFile.field_2._M_local_buf[0xf] = '\0';
  pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,pcVar4,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pcVar4 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=(local_58,pcVar4);
  std::__cxx11::string::operator+=(local_58,"/CMakeDirectoryInformation.cmake");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmMakefile::ReadListFile(this_00,pcVar4);
  if ((bVar1) && (bVar1 = cmSystemTools::GetErrorOccuredFlag(), !bVar1)) {
    dirInfoFile.field_2._M_local_buf[0xf] = '\x01';
  }
  if ((dirInfoFile.field_2._M_local_buf[0xf] & 1U) == 0) {
    cmSystemTools::Error("Directory Information file not found",(char *)0x0,(char *)0x0,(char *)0x0)
    ;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_98,"CMAKE_FORCE_UNIX_PATHS",
               (allocator *)((long)&relativePathTopSource + 7));
    pcVar4 = cmMakefile::GetDefinition(this_00,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&relativePathTopSource + 7));
    local_78 = pcVar4;
    if ((pcVar4 != (char *)0x0) && (bVar1 = cmSystemTools::IsOff(pcVar4), !bVar1)) {
      cmSystemTools::SetForceUnixPaths(true);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"CMAKE_RELATIVE_PATH_TOP_SOURCE",&local_c9);
    pcVar4 = cmMakefile::GetDefinition(this_00,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    local_a8 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)&relativePathTopBinary,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot);
      cmStateDirectory::SetRelativePathTopSource
                ((cmStateDirectory *)&relativePathTopBinary,local_a8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"CMAKE_RELATIVE_PATH_TOP_BINARY",&local_121);
    pcVar4 = cmMakefile::GetDefinition(this_00,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    local_100 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)((long)&dir.field_2 + 8),
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot);
      cmStateDirectory::SetRelativePathTopBinary
                ((cmStateDirectory *)((long)&dir.field_2 + 8),local_100);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_170,targetDir,(allocator *)(ruleFileNameFull.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(ruleFileNameFull.field_2._M_local_buf + 0xf))
  ;
  std::__cxx11::string::string((string *)&ruleFileStream.field_0x240,local_170);
  std::__cxx11::string::operator+=((string *)&ruleFileStream.field_0x240,"/depend.make");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  EVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_3e0,pcVar4,false,EVar3);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_3e0,true);
  bVar2 = std::ios::operator!((ios *)(local_3e0 + (long)*(_func_int **)((long)local_3e0 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)&internalRuleFileStream.field_0x240,local_170);
    std::__cxx11::string::operator+=
              ((string *)&internalRuleFileStream.field_0x240,"/depend.internal");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    EVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&langStr,pcVar4,false,EVar3);
    bVar2 = std::ios::operator!((ios *)((long)&langStr + *(long *)(langStr + -0x18)));
    if ((bVar2 & 1) == 0) {
      WriteDisclaimer(this,(ostream *)local_3e0);
      WriteDisclaimer(this,(ostream *)&langStr);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_678,"CMAKE_DEPENDS_LANGUAGES",
                 (allocator *)
                 ((long)&langs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pcVar4 = cmMakefile::GetSafeDefinition(this_00,&local_678);
      std::__cxx11::string::~string((string *)&local_678);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&langs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_658 = pcVar4;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_698);
      pcVar4 = local_658;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_6b8,pcVar4,(allocator *)((long)&li._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_6b8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_698,false);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&li._M_current + 7));
      local_6c8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_698);
      while( true ) {
        lang.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_698);
        bVar1 = __gnu_cxx::operator!=
                          (&local_6c8,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&lang.field_2 + 8));
        if (!bVar1) break;
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_6c8);
        std::__cxx11::string::string((string *)&scanner,(string *)pbVar5);
        local_6f8 = (cmDependsC *)0x0;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&scanner,"C");
        if ((((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&scanner,"CXX"), bVar1)) ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&scanner,"RC"), bVar1)) ||
           ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&scanner,"ASM"), bVar1 ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&scanner,"CUDA"), bVar1)))) {
          local_6f8 = (cmDependsC *)operator_new(0x5a8);
          cmDependsC::cmDependsC
                    (local_6f8,(cmLocalGenerator *)this,targetDir,(string *)&scanner,validDeps);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&scanner,"Fortran");
          if (bVar1) {
            local_6f8 = (cmDependsC *)operator_new(0x108);
            cmDependsFortran::cmDependsFortran
                      ((cmDependsFortran *)local_6f8,(cmLocalGenerator *)this);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&scanner,"Java");
            if (bVar1) {
              local_6f8 = (cmDependsC *)operator_new(0xb0);
              cmDependsJava::cmDependsJava((cmDependsJava *)local_6f8);
            }
          }
        }
        if (local_6f8 != (cmDependsC *)0x0) {
          cmDepends::SetLocalGenerator(&local_6f8->super_cmDepends,(cmLocalGenerator *)this);
          this_01 = cmGlobalGenerator::GetCMakeInstance
                              ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                               GlobalGenerator);
          fc = cmake::GetFileComparison(this_01);
          cmDepends::SetFileComparison(&local_6f8->super_cmDepends,fc);
          cmDepends::SetLanguage(&local_6f8->super_cmDepends,(string *)&scanner);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmDepends::SetTargetDirectory(&local_6f8->super_cmDepends,pcVar4);
          cmDepends::Write(&local_6f8->super_cmDepends,(ostream *)local_3e0,(ostream *)&langStr);
          if (local_6f8 != (cmDependsC *)0x0) {
            (*(local_6f8->super_cmDepends)._vptr_cmDepends[1])();
          }
        }
        std::__cxx11::string::~string((string *)&scanner);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_6c8);
      }
      this_local._7_1_ = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_698);
    }
    else {
      this_local._7_1_ = false;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&langStr);
    std::__cxx11::string::~string((string *)&internalRuleFileStream.field_0x240);
  }
  else {
    this_local._7_1_ = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_3e0);
  std::__cxx11::string::~string((string *)&ruleFileStream.field_0x240);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_58);
  return this_local._7_1_;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::ScanDependencies(
  const char* targetDir,
  std::map<std::string, cmDepends::DependencyVector>& validDeps)
{
  // Read the directory information file.
  cmMakefile* mf = this->Makefile;
  bool haveDirectoryInfo = false;
  std::string dirInfoFile = this->GetCurrentBinaryDirectory();
  dirInfoFile += cmake::GetCMakeFilesDirectory();
  dirInfoFile += "/CMakeDirectoryInformation.cmake";
  if (mf->ReadListFile(dirInfoFile.c_str()) &&
      !cmSystemTools::GetErrorOccuredFlag()) {
    haveDirectoryInfo = true;
  }

  // Lookup useful directory information.
  if (haveDirectoryInfo) {
    // Test whether we need to force Unix paths.
    if (const char* force = mf->GetDefinition("CMAKE_FORCE_UNIX_PATHS")) {
      if (!cmSystemTools::IsOff(force)) {
        cmSystemTools::SetForceUnixPaths(true);
      }
    }

    // Setup relative path top directories.
    if (const char* relativePathTopSource =
          mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_SOURCE")) {
      this->StateSnapshot.GetDirectory().SetRelativePathTopSource(
        relativePathTopSource);
    }
    if (const char* relativePathTopBinary =
          mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_BINARY")) {
      this->StateSnapshot.GetDirectory().SetRelativePathTopBinary(
        relativePathTopBinary);
    }
  } else {
    cmSystemTools::Error("Directory Information file not found");
  }

  // create the file stream for the depends file
  std::string dir = targetDir;

  // Open the make depends file.  This should be copy-if-different
  // because the make tool may try to reload it needlessly otherwise.
  std::string ruleFileNameFull = dir;
  ruleFileNameFull += "/depend.make";
  cmGeneratedFileStream ruleFileStream(
    ruleFileNameFull.c_str(), false,
    this->GlobalGenerator->GetMakefileEncoding());
  ruleFileStream.SetCopyIfDifferent(true);
  if (!ruleFileStream) {
    return false;
  }

  // Open the cmake dependency tracking file.  This should not be
  // copy-if-different because dependencies are re-scanned when it is
  // older than the DependInfo.cmake.
  std::string internalRuleFileNameFull = dir;
  internalRuleFileNameFull += "/depend.internal";
  cmGeneratedFileStream internalRuleFileStream(
    internalRuleFileNameFull.c_str(), false,
    this->GlobalGenerator->GetMakefileEncoding());
  if (!internalRuleFileStream) {
    return false;
  }

  this->WriteDisclaimer(ruleFileStream);
  this->WriteDisclaimer(internalRuleFileStream);

  // for each language we need to scan, scan it
  const char* langStr = mf->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES");
  std::vector<std::string> langs;
  cmSystemTools::ExpandListArgument(langStr, langs);
  for (std::vector<std::string>::iterator li = langs.begin();
       li != langs.end(); ++li) {
    // construct the checker
    std::string lang = *li;

    // Create the scanner for this language
    cmDepends* scanner = CM_NULLPTR;
    if (lang == "C" || lang == "CXX" || lang == "RC" || lang == "ASM" ||
        lang == "CUDA") {
      // TODO: Handle RC (resource files) dependencies correctly.
      scanner = new cmDependsC(this, targetDir, lang, &validDeps);
    }
#ifdef CMAKE_BUILD_WITH_CMAKE
    else if (lang == "Fortran") {
      scanner = new cmDependsFortran(this);
    } else if (lang == "Java") {
      scanner = new cmDependsJava();
    }
#endif

    if (scanner) {
      scanner->SetLocalGenerator(this);
      scanner->SetFileComparison(
        this->GlobalGenerator->GetCMakeInstance()->GetFileComparison());
      scanner->SetLanguage(lang);
      scanner->SetTargetDirectory(dir.c_str());
      scanner->Write(ruleFileStream, internalRuleFileStream);

      // free the scanner for this language
      delete scanner;
    }
  }

  return true;
}